

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Fx(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_48;
  uint local_44;
  int fVeryVerbose;
  int fVerbose;
  int c;
  int fReverse;
  int LitCountMax;
  int nNewNodesMax;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fReverse = 1000000;
  c = 0;
  fVerbose = 0;
  local_44 = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
LAB_0024dead:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"NMrvwh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Shrink(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManHasMapping(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"Abc_CommandAbc9Shrink(): Mapping of the AIG is not defined.\n");
        return 1;
      }
      pNew = Gia_ManPerformFx(pAbc->pGia,fReverse,c,fVerbose,local_44,local_48);
      if (pNew == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Fx(): Command has failed.\n");
      }
      else {
        Abc_FrameUpdateGia(pAbc,pNew);
      }
      return 0;
    }
    switch(iVar1) {
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_0024e0a7;
      }
      c = atoi(argv[globalUtilOptind]);
      iVar1 = c;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_0024e0a7;
      }
      fReverse = atoi(argv[globalUtilOptind]);
      iVar1 = fReverse;
      break;
    default:
      goto LAB_0024e0a7;
    case 0x68:
      goto LAB_0024e0a7;
    case 0x72:
      fVerbose = fVerbose ^ 1;
      goto LAB_0024dead;
    case 0x76:
      local_44 = local_44 ^ 1;
      goto LAB_0024dead;
    case 0x77:
      local_48 = local_48 ^ 1;
      goto LAB_0024dead;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0024e0a7:
      Abc_Print(-2,"usage: &fx [-NM <num>] [-vh]\n");
      Abc_Print(-2,
                "\t           extract shared logic using the classical \"fast_extract\" algorithm\n"
               );
      Abc_Print(-2,"\t-N <num> : max number of divisors to extract during this run [default = %d]\n"
                ,(ulong)(uint)fReverse);
      Abc_Print(-2,
                "\t-M <num> : upper bound on literal count of divisors to extract [default = %d]\n",
                (ulong)(uint)c);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-r       : reversing variable order during ISOP computation [default = %s]\n",
                pcVar2);
      pcVar2 = "no";
      if (local_44 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v       : print verbose information [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_48 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-w       : toggle printing additional information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Fx( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int nNewNodesMax = 1000000;
    int LitCountMax  =       0;
    int fReverse     =       0;
    int c, fVerbose  =       0;
    int fVeryVerbose =       0;
    // set the defaults
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "NMrvwh")) != EOF )
    {
        switch (c)
        {
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                    goto usage;
                }
                nNewNodesMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nNewNodesMax < 0 )
                    goto usage;
                break;
            case 'M':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                    goto usage;
                }
                LitCountMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( LitCountMax < 0 )
                    goto usage;
                break;
            case 'r':
                fReverse ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'w':
                fVeryVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): There is no AIG.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    pTemp = Gia_ManPerformFx( pAbc->pGia, nNewNodesMax, LitCountMax, fReverse, fVerbose, fVeryVerbose );
    if ( pTemp != NULL )
        Abc_FrameUpdateGia( pAbc, pTemp );
    else
        Abc_Print( -1, "Abc_CommandAbc9Fx(): Command has failed.\n" );
    return 0;

usage:
    Abc_Print( -2, "usage: &fx [-NM <num>] [-vh]\n");
    Abc_Print( -2, "\t           extract shared logic using the classical \"fast_extract\" algorithm\n");
    Abc_Print( -2, "\t-N <num> : max number of divisors to extract during this run [default = %d]\n", nNewNodesMax );
    Abc_Print( -2, "\t-M <num> : upper bound on literal count of divisors to extract [default = %d]\n", LitCountMax );
    Abc_Print( -2, "\t-r       : reversing variable order during ISOP computation [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-v       : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}